

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O0

void __thiscall
RenX::LadderDatabase::updateLadder(LadderDatabase *this,Server *server,TeamType *team)

{
  bool bVar1;
  int __fd;
  _List_node_base *p_Var2;
  _List_node_base *__n;
  pointer pPVar3;
  Entry *this_00;
  reference pPVar4;
  size_t sVar5;
  rep rVar6;
  rep rVar7;
  ostream *this_01;
  ulong uVar8;
  void *__buf;
  __sv_type msg;
  undefined1 local_d8 [8];
  string str;
  duration<long,_std::ratio<1L,_1000000000L>_> local_b0;
  duration write_duration;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_a0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_98;
  duration sort_duration;
  time_point start_time;
  duration<long,_std::ratio<1L,_1L>_> local_80;
  uint32_t local_74;
  uint32_t local_70;
  anon_class_1_0_00000001 local_69;
  milliseconds mStack_68;
  anon_class_1_0_00000001 set_if_greater;
  duration<long,_std::ratio<1L,_1L>_> local_60;
  duration<long,_std::ratio<1L,_1000L>_> local_58;
  duration<long,_std::ratio<1L,_1L>_> local_50;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  duration<long,_std::ratio<1L,_1L>_> local_40;
  _Self local_38;
  _Self local_30;
  iterator player;
  Entry *entry;
  TeamType *team_local;
  Server *server_local;
  LadderDatabase *this_local;
  
  p_Var2 = (_List_node_base *)
           std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                     (&server->players);
  __n = (_List_node_base *)Server::getBotCount(server);
  if (p_Var2 != __n) {
    if (this->OnPreUpdateLadder != (PreUpdateLadderFunction *)0x0) {
      (*this->OnPreUpdateLadder)(this,server,team);
    }
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                   (&server->players);
    while( true ) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                     (&server->players);
      bVar1 = std::operator==(&local_30,&local_38);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
      if ((pPVar3->steamid != 0) &&
         (pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30),
         (pPVar3->ban_flags & 4) == 0)) {
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        player._M_node = (_List_node_base *)getPlayerEntry(this,pPVar3->steamid);
        if ((Entry *)player._M_node == (Entry *)0x0) {
          this_00 = (Entry *)operator_new(0x140);
          memset(this_00,0,0x140);
          Entry::Entry(this_00);
          player._M_node = (_List_node_base *)this_00;
          append(this,this_00);
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          (player._M_node)->_M_prev = (_List_node_base *)pPVar3->steamid;
        }
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        uVar8 = (ulong)pPVar3->score;
        player._M_node[1]._M_next =
             (_List_node_base *)
             ((long)&(player._M_node[1]._M_next)->_M_next +
             (uVar8 | (long)(pPVar3->score - 9.223372036854776e+18) & (long)uVar8 >> 0x3f));
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        *(uint *)&player._M_node[2]._M_prev = *(int *)&player._M_node[2]._M_prev + pPVar3->kills;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        *(uint *)((long)&player._M_node[2]._M_prev + 4) =
             *(int *)((long)&player._M_node[2]._M_prev + 4) + pPVar3->deaths;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        *(uint *)&player._M_node[3]._M_next = *(int *)&player._M_node[3]._M_next + pPVar3->headshots
        ;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        *(uint *)((long)&player._M_node[3]._M_next + 4) =
             *(int *)((long)&player._M_node[3]._M_next + 4) + pPVar3->vehicleKills;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        *(uint *)&player._M_node[3]._M_prev =
             *(int *)&player._M_node[3]._M_prev + pPVar3->buildingKills;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        *(uint *)((long)&player._M_node[3]._M_prev + 4) =
             *(int *)((long)&player._M_node[3]._M_prev + 4) + pPVar3->defenceKills;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        *(uint *)&player._M_node[4]._M_next = *(int *)&player._M_node[4]._M_next + pPVar3->captures;
        pPVar4 = std::_List_iterator<RenX::PlayerInfo>::operator*(&local_30);
        local_48.__r = (rep)Server::getGameTime(server,pPVar4);
        local_40.__r = (rep)std::chrono::
                            duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000l>>
                                      (&local_48);
        rVar6 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_40);
        *(int *)((long)&player._M_node[4]._M_next + 4) =
             *(int *)((long)&player._M_node[4]._M_next + 4) + (int)rVar6;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        *(uint *)&player._M_node[5]._M_next =
             *(int *)&player._M_node[5]._M_next + pPVar3->beaconPlacements;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        *(uint *)((long)&player._M_node[5]._M_next + 4) =
             *(int *)((long)&player._M_node[5]._M_next + 4) + pPVar3->beaconDisarms;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        *(uint *)&player._M_node[5]._M_prev =
             *(int *)&player._M_node[5]._M_prev + pPVar3->proxy_placements;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        *(uint *)((long)&player._M_node[5]._M_prev + 4) =
             *(int *)((long)&player._M_node[5]._M_prev + 4) + pPVar3->proxy_disarms;
        *(int *)&player._M_node[4]._M_prev = *(int *)&player._M_node[4]._M_prev + 1;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        if (pPVar3->team == GDI) {
          *(int *)&player._M_node[6]._M_next = *(int *)&player._M_node[6]._M_next + 1;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          if (pPVar3->team == *team) {
            *(int *)((long)&player._M_node[4]._M_prev + 4) =
                 *(int *)((long)&player._M_node[4]._M_prev + 4) + 1;
            *(int *)((long)&player._M_node[6]._M_next + 4) =
                 *(int *)((long)&player._M_node[6]._M_next + 4) + 1;
          }
          else if (*team == None) {
            *(int *)&player._M_node[6]._M_prev = *(int *)&player._M_node[6]._M_prev + 1;
          }
          pPVar4 = std::_List_iterator<RenX::PlayerInfo>::operator*(&local_30);
          local_58.__r = (rep)Server::getGameTime(server,pPVar4);
          local_50.__r = (rep)std::chrono::
                              duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000l>>
                                        (&local_58);
          rVar6 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_50);
          *(int *)((long)&player._M_node[6]._M_prev + 4) =
               *(int *)((long)&player._M_node[6]._M_prev + 4) + (int)rVar6;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          uVar8 = (ulong)pPVar3->score;
          player._M_node[1]._M_prev =
               (_List_node_base *)
               ((long)&(player._M_node[1]._M_prev)->_M_next +
               (uVar8 | (long)(pPVar3->score - 9.223372036854776e+18) & (long)uVar8 >> 0x3f));
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)&player._M_node[7]._M_next =
               pPVar3->beaconPlacements + *(int *)&player._M_node[7]._M_next;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)((long)&player._M_node[7]._M_next + 4) =
               pPVar3->beaconDisarms + *(int *)((long)&player._M_node[7]._M_next + 4);
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)&player._M_node[7]._M_prev =
               pPVar3->proxy_placements + *(int *)&player._M_node[7]._M_prev;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)((long)&player._M_node[7]._M_prev + 4) =
               pPVar3->proxy_disarms + *(int *)((long)&player._M_node[7]._M_prev + 4);
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)&player._M_node[8]._M_next = pPVar3->kills + *(int *)&player._M_node[8]._M_next;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)((long)&player._M_node[8]._M_next + 4) =
               pPVar3->deaths + *(int *)((long)&player._M_node[8]._M_next + 4);
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)&player._M_node[8]._M_prev =
               pPVar3->vehicleKills + *(int *)&player._M_node[8]._M_prev;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)((long)&player._M_node[8]._M_prev + 4) =
               pPVar3->defenceKills + *(int *)((long)&player._M_node[8]._M_prev + 4);
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)&player._M_node[9]._M_next =
               pPVar3->buildingKills + *(int *)&player._M_node[9]._M_next;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)((long)&player._M_node[9]._M_next + 4) =
               pPVar3->headshots + *(int *)((long)&player._M_node[9]._M_next + 4);
        }
        else if (pPVar3->team == Nod) {
          *(int *)&player._M_node[9]._M_prev = *(int *)&player._M_node[9]._M_prev + 1;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          if (pPVar3->team == *team) {
            *(int *)((long)&player._M_node[4]._M_prev + 4) =
                 *(int *)((long)&player._M_node[4]._M_prev + 4) + 1;
            *(int *)((long)&player._M_node[9]._M_prev + 4) =
                 *(int *)((long)&player._M_node[9]._M_prev + 4) + 1;
          }
          else if (*team == None) {
            *(int *)&player._M_node[10]._M_next = *(int *)&player._M_node[10]._M_next + 1;
          }
          pPVar4 = std::_List_iterator<RenX::PlayerInfo>::operator*(&local_30);
          mStack_68 = Server::getGameTime(server,pPVar4);
          local_60.__r = (rep)std::chrono::
                              duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000l>>
                                        (&stack0xffffffffffffff98);
          rVar6 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_60);
          *(int *)((long)&player._M_node[10]._M_next + 4) =
               *(int *)((long)&player._M_node[10]._M_next + 4) + (int)rVar6;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          uVar8 = (ulong)pPVar3->score;
          player._M_node[2]._M_next =
               (_List_node_base *)
               ((long)&(player._M_node[2]._M_next)->_M_next +
               (uVar8 | (long)(pPVar3->score - 9.223372036854776e+18) & (long)uVar8 >> 0x3f));
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)&player._M_node[10]._M_prev =
               pPVar3->beaconPlacements + *(int *)&player._M_node[10]._M_prev;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)((long)&player._M_node[10]._M_prev + 4) =
               pPVar3->beaconDisarms + *(int *)((long)&player._M_node[10]._M_prev + 4);
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)&player._M_node[0xb]._M_next =
               pPVar3->proxy_placements + *(int *)&player._M_node[0xb]._M_next;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)((long)&player._M_node[0xb]._M_next + 4) =
               pPVar3->proxy_disarms + *(int *)((long)&player._M_node[0xb]._M_next + 4);
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)&player._M_node[0xb]._M_prev =
               pPVar3->kills + *(int *)&player._M_node[0xb]._M_prev;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)((long)&player._M_node[0xb]._M_prev + 4) =
               pPVar3->deaths + *(int *)((long)&player._M_node[0xb]._M_prev + 4);
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)&player._M_node[0xc]._M_next =
               pPVar3->vehicleKills + *(int *)&player._M_node[0xc]._M_next;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)((long)&player._M_node[0xc]._M_next + 4) =
               pPVar3->defenceKills + *(int *)((long)&player._M_node[0xc]._M_next + 4);
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)&player._M_node[0xc]._M_prev =
               pPVar3->buildingKills + *(int *)&player._M_node[0xc]._M_prev;
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          *(uint *)((long)&player._M_node[0xc]._M_prev + 4) =
               pPVar3->headshots + *(int *)((long)&player._M_node[0xc]._M_prev + 4);
        }
        else {
          pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          if (pPVar3->team == *team) {
            *(int *)((long)&player._M_node[4]._M_prev + 4) =
                 *(int *)((long)&player._M_node[4]._M_prev + 4) + 1;
          }
        }
        local_69 = (anon_class_1_0_00000001)0x0;
        p_Var2 = player._M_node + 0xd;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        local_70 = (uint32_t)(long)pPVar3->score;
        updateLadder::anon_class_1_0_00000001::operator()(&local_69,(uint32_t *)p_Var2,&local_70);
        p_Var2 = player._M_node + 0xd;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        updateLadder::anon_class_1_0_00000001::operator()
                  (&local_69,(uint32_t *)((long)&p_Var2->_M_next + 4),&pPVar3->kills);
        p_Var2 = player._M_node + 0xd;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        updateLadder::anon_class_1_0_00000001::operator()
                  (&local_69,(uint32_t *)&p_Var2->_M_prev,&pPVar3->deaths);
        p_Var2 = player._M_node + 0xd;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        updateLadder::anon_class_1_0_00000001::operator()
                  (&local_69,(uint32_t *)((long)&p_Var2->_M_prev + 4),&pPVar3->headshots);
        p_Var2 = player._M_node + 0xe;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        updateLadder::anon_class_1_0_00000001::operator()
                  (&local_69,(uint32_t *)p_Var2,&pPVar3->vehicleKills);
        p_Var2 = player._M_node + 0xe;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        updateLadder::anon_class_1_0_00000001::operator()
                  (&local_69,(uint32_t *)((long)&p_Var2->_M_next + 4),&pPVar3->buildingKills);
        p_Var2 = player._M_node + 0xe;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        updateLadder::anon_class_1_0_00000001::operator()
                  (&local_69,(uint32_t *)&p_Var2->_M_prev,&pPVar3->defenceKills);
        p_Var2 = player._M_node + 0xe;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        updateLadder::anon_class_1_0_00000001::operator()
                  (&local_69,(uint32_t *)((long)&p_Var2->_M_prev + 4),&pPVar3->captures);
        p_Var2 = player._M_node + 0xf;
        pPVar4 = std::_List_iterator<RenX::PlayerInfo>::operator*(&local_30);
        start_time.__d.__r = (duration)Server::getGameTime(server,pPVar4);
        local_80.__r = (rep)std::chrono::
                            duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000l>>
                                      ((duration<long,_std::ratio<1L,_1000L>_> *)&start_time);
        rVar6 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_80);
        local_74 = (uint32_t)rVar6;
        updateLadder::anon_class_1_0_00000001::operator()(&local_69,(uint32_t *)p_Var2,&local_74);
        p_Var2 = player._M_node + 0xf;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        updateLadder::anon_class_1_0_00000001::operator()
                  (&local_69,(uint32_t *)((long)&p_Var2->_M_next + 4),&pPVar3->beaconPlacements);
        p_Var2 = player._M_node + 0xf;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        updateLadder::anon_class_1_0_00000001::operator()
                  (&local_69,(uint32_t *)&p_Var2->_M_prev,&pPVar3->beaconDisarms);
        p_Var2 = player._M_node + 0xf;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        updateLadder::anon_class_1_0_00000001::operator()
                  (&local_69,(uint32_t *)((long)&p_Var2->_M_prev + 4),&pPVar3->proxy_placements);
        p_Var2 = player._M_node + 0x10;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        updateLadder::anon_class_1_0_00000001::operator()
                  (&local_69,(uint32_t *)p_Var2,&pPVar3->proxy_disarms);
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        *(uint32_t *)((long)&player._M_node[0x10]._M_next + 4) = pPVar3->ip32;
        __n = (_List_node_base *)time((time_t *)0x0);
        player._M_node[0x10]._M_prev = __n;
        pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (player._M_node + 0x11),&pPVar3->name);
      }
      std::_List_iterator<RenX::PlayerInfo>::operator++(&local_30);
    }
    sort_duration.__r = std::chrono::_V2::steady_clock::now();
    sort_entries(this);
    local_a0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_98.__r = (rep)std::chrono::operator-
                                  (&local_a0,
                                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&sort_duration);
    write_duration.__r = std::chrono::_V2::steady_clock::now();
    sort_duration.__r = write_duration.__r;
    __fd = Jupiter::Database::getFilename_abi_cxx11_();
    write(this,__fd,__buf,(size_t)__n);
    str.field_2._8_8_ = std::chrono::_V2::steady_clock::now();
    local_b0.__r = (rep)std::chrono::operator-
                                  ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)((long)&str.field_2 + 8),
                                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&sort_duration);
    if ((this->m_output_times & 1U) != 0) {
      sVar5 = getEntries(this);
      rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_98);
      rVar7 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_b0);
      string_printf_abi_cxx11_
                ((string *)local_d8,
                 "Ladder: %zu entries sorted in %f seconds; Database written in %f seconds.\r\n",
                 (double)rVar6 * 1e-09,(double)rVar7 * 1e-09,sVar5);
      this_01 = std::operator<<((ostream *)&std::cout,(string *)local_d8);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      msg = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_d8);
      Server::sendLogChan(server,msg);
      std::__cxx11::string::~string((string *)local_d8);
    }
  }
  return;
}

Assistant:

void RenX::LadderDatabase::updateLadder(RenX::Server &server, const RenX::TeamType &team) {
	if (server.players.size() != server.getBotCount()) {
		// call the PreUpdateLadder event
		if (this->OnPreUpdateLadder != nullptr) {
			this->OnPreUpdateLadder(*this, server, team);
		}

		// update player stats in memory
		Entry *entry;
		for (auto player = server.players.begin(); player != server.players.end(); ++player) {
			if (player->steamid != 0 && (player->ban_flags & RenX::BanDatabase::Entry::FLAG_TYPE_LADDER) == 0) {
				entry = getPlayerEntry(player->steamid);
				if (entry == nullptr) {
					entry = new Entry();
					append(entry);
					entry->steam_id = player->steamid;
				}

				entry->total_score += static_cast<uint64_t>(player->score);

				entry->total_kills += player->kills;
				entry->total_deaths += player->deaths;
				entry->total_headshot_kills += player->headshots;
				entry->total_vehicle_kills += player->vehicleKills;
				entry->total_building_kills += player->buildingKills;
				entry->total_defence_kills += player->defenceKills;
				entry->total_captures += player->captures;
				entry->total_game_time += static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count());
				entry->total_beacon_placements += player->beaconPlacements;
				entry->total_beacon_disarms += player->beaconDisarms;
				entry->total_proxy_placements += player->proxy_placements;
				entry->total_proxy_disarms += player->proxy_disarms;

				++entry->total_games;
				switch (player->team) {
				case RenX::TeamType::GDI:
					++entry->total_gdi_games;
					if (player->team == team)
						++entry->total_wins, ++entry->total_gdi_wins;
					else if (team == RenX::TeamType::None)
						++entry->total_gdi_ties;

					entry->total_gdi_game_time += static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count());
					entry->total_gdi_score += static_cast<uint64_t>(player->score);
					entry->total_gdi_beacon_placements += player->beaconPlacements;
					entry->total_gdi_beacon_disarms += player->beaconDisarms;
					entry->total_gdi_proxy_placements += player->proxy_placements;
					entry->total_gdi_proxy_disarms += player->proxy_disarms;
					entry->total_gdi_kills += player->kills;
					entry->total_gdi_deaths += player->deaths;
					entry->total_gdi_vehicle_kills += player->vehicleKills;
					entry->total_gdi_defence_kills += player->defenceKills;
					entry->total_gdi_building_kills += player->buildingKills;
					entry->total_gdi_headshots += player->headshots;
					break;
				case RenX::TeamType::Nod:
					++entry->total_nod_games;
					if (player->team == team)
						++entry->total_wins, ++entry->total_nod_wins;
					else if (team == RenX::TeamType::None)
						++entry->total_nod_ties;

					entry->total_nod_game_time += static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count());
					entry->total_nod_score += static_cast<uint64_t>(player->score);
					entry->total_nod_beacon_placements += player->beaconPlacements;
					entry->total_nod_beacon_disarms += player->beaconDisarms;
					entry->total_nod_proxy_placements += player->proxy_placements;
					entry->total_nod_proxy_disarms += player->proxy_disarms;
					entry->total_nod_kills += player->kills;
					entry->total_nod_deaths += player->deaths;
					entry->total_nod_vehicle_kills += player->vehicleKills;
					entry->total_nod_defence_kills += player->defenceKills;
					entry->total_nod_building_kills += player->buildingKills;
					entry->total_nod_headshots += player->headshots;
					break;
				default:
					if (player->team == team)
						++entry->total_wins;
					break;
				}

				auto set_if_greater = [](uint32_t &src, const uint32_t &cmp) {
					if (cmp > src) {
						src = cmp;
					}
				};

				set_if_greater(entry->top_score, static_cast<uint32_t>(player->score));
				set_if_greater(entry->top_kills, player->kills);
				set_if_greater(entry->most_deaths, player->deaths);
				set_if_greater(entry->top_headshot_kills, player->headshots);
				set_if_greater(entry->top_vehicle_kills, player->vehicleKills);
				set_if_greater(entry->top_building_kills, player->buildingKills);
				set_if_greater(entry->top_defence_kills, player->defenceKills);
				set_if_greater(entry->top_captures, player->captures);
				set_if_greater(entry->top_game_time, static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count()));
				set_if_greater(entry->top_beacon_placements, player->beaconPlacements);
				set_if_greater(entry->top_beacon_disarms, player->beaconDisarms);
				set_if_greater(entry->top_proxy_placements, player->proxy_placements);
				set_if_greater(entry->top_proxy_disarms, player->proxy_disarms);

				entry->most_recent_ip = player->ip32;
				entry->last_game = time(nullptr);
				entry->most_recent_name = player->name;
			}
		}

		// sort new stats
		std::chrono::steady_clock::time_point start_time = std::chrono::steady_clock::now();
		sort_entries();
		std::chrono::steady_clock::duration sort_duration = std::chrono::steady_clock::now() - start_time;

		// write new stats
		start_time = std::chrono::steady_clock::now();
		write(this->getFilename());
		std::chrono::steady_clock::duration write_duration = std::chrono::steady_clock::now() - start_time;

		if (m_output_times)
		{
			std::string str = string_printf("Ladder: %zu entries sorted in %f seconds; Database written in %f seconds." ENDL,
				getEntries(),
				static_cast<double>(sort_duration.count()) * (static_cast<double>(std::chrono::steady_clock::duration::period::num) / static_cast<double>(std::chrono::steady_clock::duration::period::den) * static_cast<double>(std::chrono::seconds::duration::period::den / std::chrono::seconds::duration::period::num)),
				static_cast<double>(write_duration.count()) * (static_cast<double>(std::chrono::steady_clock::duration::period::num) / static_cast<double>(std::chrono::steady_clock::duration::period::den) * static_cast<double>(std::chrono::seconds::duration::period::den / std::chrono::seconds::duration::period::num)));
			std::cout << str << std::endl;
			server.sendLogChan(str);
		}
	}
}